

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  char *pcVar3;
  undefined8 *puVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  uint uVar9;
  String *pSVar10;
  IReporter **curr_rep;
  long lVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  anon_union_24_2_13149d16_for_String_2 local_a0;
  anon_union_24_2_13149d16_for_String_2 local_88;
  anon_union_24_2_13149d16_for_String_2 local_70;
  anon_union_24_2_13149d16_for_String_2 local_58;
  anon_union_24_2_13149d16_for_String_2 local_40;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as == true) {
        pcVar3 = (this->super_AssertData).m_exception_string;
        sVar8 = strlen(pcVar3);
        String::String((String *)&local_40.data,pcVar3,(uint)sVar8);
        if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
          pSVar10 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
        }
        else {
          pSVar10 = &(this->super_AssertData).m_exception;
        }
        uVar13 = &local_40;
        if (local_40.buf[0x17] < '\0') {
          uVar13 = local_40.data.ptr;
        }
        iVar7 = strcmp((char *)pSVar10,(char *)uVar13);
        __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        (this->super_AssertData).m_failed = iVar7 != 0;
        if ((anon_union_24_2_13149d16_for_String_2 *)local_40.data.ptr !=
            (anon_union_24_2_13149d16_for_String_2 *)0x0 && local_40.buf[0x17] < '\0') {
          operator_delete__(local_40.data.ptr);
          __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        }
      }
      else {
        (this->super_AssertData).m_failed = true;
      }
      goto LAB_00118490;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar5 = (this->super_AssertData).m_threw_as;
      goto LAB_00118434;
    }
    if ((EVar2 & is_throws_with) != 0) {
      pcVar3 = (this->super_AssertData).m_exception_string;
      sVar8 = strlen(pcVar3);
      String::String((String *)&local_40.data,pcVar3,(uint)sVar8);
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar10 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar10 = &(this->super_AssertData).m_exception;
      }
      uVar13 = &local_40;
      if (local_40.buf[0x17] < '\0') {
        uVar13 = local_40.data.ptr;
      }
      iVar7 = strcmp((char *)pSVar10,(char *)uVar13);
      __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
      (this->super_AssertData).m_failed = iVar7 != 0;
      if ((anon_union_24_2_13149d16_for_String_2 *)local_40.data.ptr !=
          (anon_union_24_2_13149d16_for_String_2 *)0x0 && local_40.buf[0x17] < '\0') {
        operator_delete__(local_40.data.ptr);
        __x = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
      }
      goto LAB_00118490;
    }
    if (-1 < (char)EVar2) goto LAB_00118490;
    bVar5 = (this->super_AssertData).m_threw;
  }
  else {
    bVar5 = (this->super_AssertData).m_threw;
LAB_00118434:
    bVar5 = bVar5 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar5;
LAB_00118490:
  bVar5 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar5 < '\0') {
    uVar9 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar9 = 0x17 - (bVar5 & 0x1f);
  }
  if (uVar9 != 0) {
    pSVar10 = &(this->super_AssertData).m_exception;
    String::String((String *)&local_70.data,"\"",1);
    operator+((String *)&local_88.data,(String *)&local_70.data,pSVar10);
    String::String((String *)&local_a0.data,"\"",1);
    operator+((String *)&local_58.data,(String *)&local_88.data,(String *)&local_a0.data);
    if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
       (pcVar3 = (pSVar10->field_0).data.ptr, pcVar3 != (char *)0x0)) {
      operator_delete__(pcVar3);
    }
    uVar14 = local_58._0_4_;
    *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
         CONCAT17(local_58.buf[0x17],local_58._16_7_);
    *(undefined4 *)&pSVar10->field_0 = local_58._0_4_;
    *(undefined4 *)((long)&(this->super_AssertData).m_exception.field_0 + 4) = local_58._4_4_;
    (this->super_AssertData).m_exception.field_0.data.size = local_58.data.size;
    (this->super_AssertData).m_exception.field_0.data.capacity = local_58.data.capacity;
    local_58._0_4_ = local_58._0_4_ & 0xffffff00;
    local_58.buf[0x17] = '\x17';
    if ((local_a0.buf[0x17] < '\0') && (local_a0.data.ptr != (char *)0x0)) {
      operator_delete__(local_a0.data.ptr);
      uVar14 = extraout_XMM0_Da_01;
      local_58._4_4_ = extraout_XMM0_Db_01;
    }
    if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
      operator_delete__(local_88.data.ptr);
      uVar14 = extraout_XMM0_Da_02;
      local_58._4_4_ = extraout_XMM0_Db_02;
    }
    __x = (double)CONCAT44(local_58._4_4_,uVar14);
    if ((local_70.buf[0x17] < '\0') &&
       (__x = (double)CONCAT44(local_58._4_4_,uVar14), local_70.data.ptr != (char *)0x0)) {
      operator_delete__(local_70.data.ptr);
      __x = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    }
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar11 = g_cs + 0xb8;
      if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar11 + *(long *)(in_FS_OFFSET + -0x18) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar4 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar12 = *(undefined8 **)(g_cs + 0x10d0); puVar12 != puVar4; puVar12 = puVar12 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar12 + 0x48))((long *)*puVar12,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar11 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar11 + *(long *)(in_FS_OFFSET + -0x18) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar6 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    if (bVar6) {
      __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }